

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cc
# Opt level: O0

bool __thiscall avro::MemoryInputStream::next(MemoryInputStream *this,uint8_t **data,size_t *len)

{
  size_t sVar1;
  const_reference ppuVar2;
  long *in_RDX;
  undefined8 *in_RSI;
  MemoryInputStream *in_RDI;
  size_t n;
  
  sVar1 = maxLen(in_RDI);
  if (sVar1 != 0) {
    ppuVar2 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                        (in_RDI->data_,in_RDI->cur_);
    *in_RSI = *ppuVar2 + in_RDI->curLen_;
    *in_RDX = sVar1 - in_RDI->curLen_;
    in_RDI->curLen_ = sVar1;
  }
  return sVar1 != 0;
}

Assistant:

bool next(const uint8_t** data, size_t* len) {
        if (size_t n = maxLen()) {
            *data = data_[cur_] + curLen_;
            *len = n - curLen_;
            curLen_ = n;
            return true;
        }
        return false;
    }